

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall
ON_PhysicallyBasedMaterial::SynchronizeLegacyMaterial(ON_PhysicallyBasedMaterial *this)

{
  ON_Material *this_00;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar1;
  ON_Color OVar2;
  int r;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double in_XMM1_Qa;
  double dVar3;
  double local_40;
  undefined1 local_30 [20];
  anon_union_4_2_6147a14e_for_ON_Color_15 local_1c;
  
  this_00 = *(ON_Material **)this->_impl;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0xd])();
  aVar1 = ON_Color::Black.field_0;
  if (extraout_XMM0_Qa <= 0.5) {
    (*this->_vptr_ON_PhysicallyBasedMaterial[5])(this);
    local_30._8_8_ = in_XMM1_Qa;
    aVar1 = (anon_union_4_2_6147a14e_for_ON_Color_15)
            ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_30);
  }
  ON_Material::SetDiffuse(this_00,(ON_Color)aVar1);
  if (0.5 < extraout_XMM0_Qa) {
    local_40 = 1.0;
  }
  else {
    (*this->_vptr_ON_PhysicallyBasedMaterial[0x15])(this);
    local_40 = 1.0 - extraout_XMM0_Qa_00;
  }
  ON_Material::SetFresnelReflections(this_00,extraout_XMM0_Qa <= 0.5);
  if (0.0 <= local_40) {
    if (local_40 <= 1.0) {
      this_00->m_reflectivity = local_40;
    }
    else {
      this_00->m_reflectivity = 1.0;
    }
  }
  else {
    this_00->m_reflectivity = 0.0;
  }
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x25])(this);
  dVar3 = 1.0 - extraout_XMM0_Qa_01;
  if (0.0 <= dVar3) {
    if (dVar3 <= 1.0) {
      this_00->m_transparency = dVar3;
    }
    else {
      this_00->m_transparency = 1.0;
    }
  }
  else {
    this_00->m_transparency = 0.0;
  }
  ON_Material::SetAmbient(this_00,ON_Color::Black);
  ON_Material::SetShine(this_00,local_40 * 255.0);
  if (0.5 < extraout_XMM0_Qa) {
    (*this->_vptr_ON_PhysicallyBasedMaterial[5])(this);
    local_30._8_8_ = dVar3;
    OVar2 = ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_30);
    ON_Material::SetSpecular(this_00,OVar2);
    (*this->_vptr_ON_PhysicallyBasedMaterial[5])(this);
    local_30._8_8_ = dVar3;
    aVar1 = (anon_union_4_2_6147a14e_for_ON_Color_15)
            ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_30);
  }
  else {
    r = (int)(local_40 * 255.0);
    ON_Color::ON_Color((ON_Color *)&local_1c,r,r,r);
    ON_Material::SetSpecular(this_00,(ON_Color)local_1c);
    aVar1 = ON_Color::White.field_0;
  }
  (this_00->m_reflection).field_0 = aVar1;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x15])(this);
  this_00->m_reflection_glossiness = extraout_XMM0_Qa_02;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x27])(this);
  this_00->m_refraction_glossiness = extraout_XMM0_Qa_03;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x29])(this);
  local_30._8_8_ = dVar3;
  OVar2 = ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_30);
  ON_Material::SetEmission(this_00,OVar2);
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x23])(this);
  this_00->m_index_of_refraction = extraout_XMM0_Qa_04;
  return;
}

Assistant:

void ON_PhysicallyBasedMaterial::SynchronizeLegacyMaterial(void)
{
  auto& mat = *Implementation().material;

  const bool bIsMetal = Metallic() > 0.5;

  mat.SetDiffuse(bIsMetal ? ON_Color::Black : (ON_Color)BaseColor());

  const double reflectivity = bIsMetal ? 1.0 : 1.0 - Roughness();

  mat.SetFresnelReflections(!bIsMetal);

  mat.SetReflectivity(reflectivity);
  mat.SetTransparency(1.0 - Opacity());
  mat.SetAmbient(ON_Color::Black);

  //Gloss
  mat.SetShine(ON_Material::MaxShine * reflectivity);

  if (bIsMetal)
  {
    mat.SetSpecular(BaseColor());
    mat.m_reflection = BaseColor();
  }
  else
  {
    const int bf = (int)(255.0 * reflectivity);
    mat.SetSpecular(ON_Color(bf, bf, bf));
    mat.m_reflection = ON_Color::White;
  }

  mat.m_reflection_glossiness = Roughness();
  mat.m_refraction_glossiness = OpacityRoughness();

  mat.SetEmission(Emission());

  mat.m_index_of_refraction = OpacityIOR();

  //No need to do the textures, because the ones that are supported are in the right channels already.
}